

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
* __thiscall Graph::paths(Graph *this,Edge *start,Edge *stop)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference ppEVar4;
  reference ppEVar5;
  reference ppEVar6;
  type in_RCX;
  Edge *in_RDI;
  Edge *pathEdge;
  iterator __end3;
  iterator __begin3;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *__range3;
  bool onPath;
  Edge *neighbour;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Edge_*,_std::allocator<Edge_*>_> *__range2;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> finishedPath;
  Edge *prev;
  int sharedNode;
  type *currEdge;
  type *curDepth;
  int dfsDepth;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> currPath;
  vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_> dfsStack;
  vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  *paths;
  value_type *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  Edge *this_00;
  pair<int,_const_Edge_*> local_128;
  Edge *local_118;
  Edge **local_110;
  __normal_iterator<const_Edge_**,_std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>
  local_108;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> *local_100;
  undefined7 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0f;
  Edge *in_stack_ffffffffffffff10;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_e0;
  vector<Edge_*,_std::allocator<Edge_*>_> *local_d8;
  value_type local_b8;
  int local_ac;
  type *local_a8;
  int *local_a0;
  undefined8 local_98;
  Edge *local_90;
  int local_84;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> local_80;
  int local_54;
  pair<int,_const_Edge_*> local_50;
  vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_> local_40;
  byte local_21;
  type local_20;
  Edge *local_18 [3];
  
  local_21 = 0;
  this_00 = in_RDI;
  local_20 = in_RCX;
  std::
  vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  ::vector((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
            *)0x11c461);
  std::vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>::vector
            ((vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_> *
             )0x11c46e);
  local_54 = 0;
  std::pair<int,_const_Edge_*>::pair<int,_const_Edge_*&,_true>(&local_50,&local_54,local_18);
  std::vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>::
  push_back((vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_> *)
            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8)
  ;
  std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector
            ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)0x11c4bc);
  local_84 = 0;
  do {
    while( true ) {
      sVar2 = std::
              vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>::
              size(&local_40);
      if (sVar2 == 0) {
        local_21 = 1;
        std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::~vector
                  ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)this_00);
        std::vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>::
        ~vector((vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
                 *)this_00);
        if ((local_21 & 1) == 0) {
          std::
          vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
          ::~vector((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                     *)this_00);
        }
        return (vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                *)this_00;
      }
      pvVar3 = std::
               vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
               ::back((vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
                       *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      local_98 = *(undefined8 *)pvVar3;
      local_90 = pvVar3->second;
      local_a0 = std::get<0ul,int,Edge_const*>((pair<int,_const_Edge_*> *)0x11c50f);
      local_a8 = std::get<1ul,int,Edge_const*>((pair<int,_const_Edge_*> *)0x11c524);
      std::vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>::
      pop_back((vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
                *)0x11c539);
      for (; *local_a0 < local_84; local_84 = local_84 + -1) {
        std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::pop_back
                  ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)0x11c559);
      }
      local_84 = local_84 + 1;
      local_ac = -1;
      sVar2 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::size(&local_80);
      if (sVar2 != 0) {
        ppEVar4 = std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::back
                            ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        local_b8 = *ppEVar4;
        in_stack_fffffffffffffec4 =
             Edge::sharedVertex(in_RDI,(Edge *)CONCAT44(in_stack_fffffffffffffec4,
                                                        in_stack_fffffffffffffec0));
        local_ac = in_stack_fffffffffffffec4;
      }
      std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::push_back
                ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)this_00,(value_type *)in_RDI
                );
      if (*local_a8 != local_20) break;
      std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::vector
                ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)in_stack_ffffffffffffff10,
                 (vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::push_back((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                   *)this_00,(value_type *)in_RDI);
      std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::~vector
                ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)this_00);
    }
    local_d8 = &(*local_a8)->neighbours;
    local_e0._M_current =
         (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_stack_fffffffffffffeb8);
    std::vector<Edge_*,_std::allocator<Edge_*>_>::end
              ((vector<Edge_*,_std::allocator<Edge_*>_> *)in_stack_fffffffffffffeb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                               *)in_stack_fffffffffffffeb8), bVar1) {
      ppEVar5 = __gnu_cxx::
                __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                operator*(&local_e0);
      in_stack_ffffffffffffff10 = *ppEVar5;
      in_stack_ffffffffffffff0f = 0;
      bVar1 = Edge::connectsTo(in_stack_ffffffffffffff10,local_ac);
      in_stack_fffffffffffffec0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec0);
      if (!bVar1) {
        local_100 = &local_80;
        local_108._M_current =
             (Edge **)std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::begin
                                ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
                                 in_stack_fffffffffffffeb8);
        local_110 = (Edge **)std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>::end
                                       ((vector<const_Edge_*,_std::allocator<const_Edge_*>_> *)
                                        in_stack_fffffffffffffeb8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_Edge_**,_std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  (__normal_iterator<const_Edge_**,_std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>
                                   *)in_stack_fffffffffffffeb8), bVar1) {
          ppEVar6 = __gnu_cxx::
                    __normal_iterator<const_Edge_**,_std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>
                    ::operator*(&local_108);
          local_118 = *ppEVar6;
          if (local_118 == in_stack_ffffffffffffff10) {
            in_stack_ffffffffffffff0f = 1;
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_Edge_**,_std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>
          ::operator++(&local_108);
        }
        if ((in_stack_ffffffffffffff0f & 1) == 0) {
          std::pair<int,_const_Edge_*>::pair<int_&,_const_Edge_*&,_true>
                    (&local_128,&local_84,(Edge **)&stack0xffffffffffffff10);
          std::vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
          ::push_back((vector<std::pair<int,_const_Edge_*>,_std::allocator<std::pair<int,_const_Edge_*>_>_>
                       *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffeb8);
        }
      }
      __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator++(&local_e0);
    }
  } while( true );
}

Assistant:

std::vector<std::vector<const Edge*>> Graph::paths(const Edge* start, const Edge* stop) {
  std::vector<std::vector<const Edge*>> paths;
  std::vector<std::pair<int, const Edge*>> dfsStack; //store depth at which edge has been found to know how often we need to backtrack
  dfsStack.push_back({0, start});
  std::vector<const Edge*> currPath;
  int dfsDepth = 0;
 
  while(dfsStack.size() > 0) {
    auto [curDepth, currEdge] = dfsStack.back();
    dfsStack.pop_back();
    while(dfsDepth > curDepth) {
      currPath.pop_back();
      dfsDepth--;
    }
    dfsDepth++;

    int sharedNode = -1;
    if(currPath.size() > 0) {
      const Edge* prev = currPath.back();
      sharedNode = currEdge->sharedVertex(prev);
      
    }
    currPath.push_back(currEdge);
    
    if(currEdge == stop) { //finnished path
      std::vector<const Edge*> finishedPath(currPath);
      paths.push_back(finishedPath);
      continue;
    }

    for(const Edge* neighbour: currEdge->neighbours) {
      bool onPath = false;

      //cant make sudden turns in a fork
      if(neighbour->connectsTo(sharedNode)) {
        continue;
      }
      
      for(const Edge* pathEdge: currPath) {
        if(pathEdge == neighbour) {
          onPath = true;
          break;
        }
      }
      if(onPath)
        continue;
      
      dfsStack.push_back({dfsDepth, neighbour});
    }
  }
  return paths;
}